

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailure.cpp
# Opt level: O0

void __thiscall
MockFailure::addExpectationsAndCallHistoryRelatedTo
          (MockFailure *this,SimpleString *name,MockExpectedCallsList *expectations)

{
  SimpleString local_80;
  MockExpectedCallsList local_70;
  SimpleString local_60;
  MockExpectedCallsList local_50 [2];
  undefined1 local_30 [8];
  MockExpectedCallsList expectationsForFunction;
  MockExpectedCallsList *expectations_local;
  SimpleString *name_local;
  MockFailure *this_local;
  
  expectationsForFunction.head_ = (MockExpectedCallsListNode *)expectations;
  MockExpectedCallsList::MockExpectedCallsList((MockExpectedCallsList *)local_30);
  MockExpectedCallsList::addExpectationsRelatedTo
            ((MockExpectedCallsList *)local_30,name,
             (MockExpectedCallsList *)expectationsForFunction.head_);
  SimpleString::operator+=
            (&(this->super_TestFailure).message_,
             "\tEXPECTED calls that WERE NOT fulfilled related to function: ");
  SimpleString::operator+=(&(this->super_TestFailure).message_,name);
  SimpleString::operator+=(&(this->super_TestFailure).message_,"\n");
  SimpleString::SimpleString(&local_60,"\t\t");
  MockExpectedCallsList::unfulfilledCallsToString(local_50,(SimpleString *)local_30);
  SimpleString::operator+=(&(this->super_TestFailure).message_,(SimpleString *)local_50);
  SimpleString::~SimpleString((SimpleString *)local_50);
  SimpleString::~SimpleString(&local_60);
  SimpleString::operator+=
            (&(this->super_TestFailure).message_,
             "\n\tEXPECTED calls that WERE fulfilled related to function: ");
  SimpleString::operator+=(&(this->super_TestFailure).message_,name);
  SimpleString::operator+=(&(this->super_TestFailure).message_,"\n");
  SimpleString::SimpleString(&local_80,"\t\t");
  MockExpectedCallsList::fulfilledCallsToString(&local_70,(SimpleString *)local_30);
  SimpleString::operator+=(&(this->super_TestFailure).message_,(SimpleString *)&local_70);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  SimpleString::~SimpleString(&local_80);
  MockExpectedCallsList::~MockExpectedCallsList((MockExpectedCallsList *)local_30);
  return;
}

Assistant:

void MockFailure::addExpectationsAndCallHistoryRelatedTo(const SimpleString& name, const MockExpectedCallsList& expectations)
{
    MockExpectedCallsList expectationsForFunction;
    expectationsForFunction.addExpectationsRelatedTo(name, expectations);

    message_ += "\tEXPECTED calls that WERE NOT fulfilled related to function: ";
    message_ += name;
    message_ += "\n";

    message_ += expectationsForFunction.unfulfilledCallsToString("\t\t");

    message_ += "\n\tEXPECTED calls that WERE fulfilled related to function: ";
    message_ += name;
    message_ += "\n";

    message_ += expectationsForFunction.fulfilledCallsToString("\t\t");
}